

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<float> * __thiscall
cimg_library::CImg<float>::assign(CImg<float> *this,uint size_x,uint size_y,uint size_z,uint size_c)

{
  float *pfVar1;
  CImg<float> *pCVar2;
  CImgArgumentException *this_00;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  ulong uVar3;
  undefined4 in_register_00000034;
  char *pcVar4;
  
  uVar3 = (ulong)size_x * (ulong)size_c * (ulong)size_z * (ulong)size_y;
  if (uVar3 == 0) {
    pCVar2 = assign(this);
    return pCVar2;
  }
  if (uVar3 - (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width != 0) {
    if (this->_is_shared == true) {
      this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
      pcVar4 = "non-";
      if (this->_is_shared != false) {
        pcVar4 = "";
      }
      CImgArgumentException::CImgArgumentException
                (this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::assign(): Invalid assignment request of shared instance from specified image (%u,%u,%u,%u)."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar4,"float",
                 CONCAT44(in_register_00000034,size_x),CONCAT44(in_register_00000014,size_y),
                 CONCAT44(in_register_0000000c,size_z),(ulong)size_c);
      __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
    }
    if (this->_data != (float *)0x0) {
      operator_delete__(this->_data);
    }
    pfVar1 = (float *)operator_new__(-(ulong)(uVar3 >> 0x3e != 0) | uVar3 * 4);
    this->_data = pfVar1;
  }
  this->_width = size_x;
  this->_height = size_y;
  this->_depth = size_z;
  this->_spectrum = size_c;
  return this;
}

Assistant:

CImg<T>& assign(const unsigned int size_x, const unsigned int size_y=1,
                    const unsigned int size_z=1, const unsigned int size_c=1) {
      const size_t siz = (size_t)size_x*size_y*size_z*size_c;
      if (!siz) return assign();
      const size_t curr_siz = (size_t)size();
      if (siz!=curr_siz) {
	if (_is_shared)
          throw CImgArgumentException(_cimg_instance
                                      "assign(): Invalid assignment request of shared instance from specified "
                                      "image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      size_x,size_y,size_z,size_c);
	else {
          delete[] _data;
          try { _data = new T[siz]; } catch (...) {
            _width = _height = _depth = _spectrum = 0; _data = 0;
            throw CImgInstanceException(_cimg_instance
                                        "assign(): Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                        cimg_instance,
                                        cimg::strbuffersize(sizeof(T)*size_x*size_y*size_z*size_c),
                                        size_x,size_y,size_z,size_c);
          }
        }
      }
      _width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c;
      return *this;
    }